

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Compaction * __thiscall
leveldb::VersionSet::CompactRange(VersionSet *this,int level,InternalKey *begin,InternalKey *end)

{
  bool bVar1;
  uint64_t uVar2;
  size_type sVar3;
  reference ppFVar4;
  Compaction *c;
  uint64_t s;
  size_t i;
  uint64_t total;
  uint64_t limit;
  undefined1 local_48 [8];
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> inputs;
  InternalKey *end_local;
  InternalKey *begin_local;
  int level_local;
  VersionSet *this_local;
  
  inputs.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)end;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_48);
  Version::GetOverlappingInputs
            (this->current_,level,begin,
             (InternalKey *)
             inputs.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_48);
  bVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     local_48);
  if (bVar1) {
    this_local = (VersionSet *)0x0;
  }
  else {
    if (0 < level) {
      uVar2 = MaxFileSizeForLevel(this->options_,level);
      i = 0;
      for (s = 0; sVar3 = std::
                          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ::size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  *)local_48), s < sVar3; s = s + 1) {
        ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              *)local_48,s);
        i = (*ppFVar4)->file_size + i;
        if (uVar2 <= i) {
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::resize
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     local_48,s + 1);
          break;
        }
      }
    }
    this_local = (VersionSet *)operator_new(0x158);
    Compaction::Compaction((Compaction *)this_local,this->options_,level);
    (this_local->dbname_)._M_string_length = (size_type)this->current_;
    Version::Ref((Version *)(this_local->dbname_)._M_string_length);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &(this_local->dummy_versions_).files_[1].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_48
              );
    SetupOtherInputs(this,(Compaction *)this_local);
  }
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_48);
  return (Compaction *)this_local;
}

Assistant:

Compaction* VersionSet::CompactRange(int level, const InternalKey* begin,
                                     const InternalKey* end) {
  std::vector<FileMetaData*> inputs;
  current_->GetOverlappingInputs(level, begin, end, &inputs);
  if (inputs.empty()) {
    return nullptr;
  }

  // Avoid compacting too much in one shot in case the range is large.
  // But we cannot do this for level-0 since level-0 files can overlap
  // and we must not pick one file and drop another older file if the
  // two files overlap.
  if (level > 0) {
    const uint64_t limit = MaxFileSizeForLevel(options_, level);
    uint64_t total = 0;
    for (size_t i = 0; i < inputs.size(); i++) {
      uint64_t s = inputs[i]->file_size;
      total += s;
      if (total >= limit) {
        inputs.resize(i + 1);
        break;
      }
    }
  }

  Compaction* c = new Compaction(options_, level);
  c->input_version_ = current_;
  c->input_version_->Ref();
  c->inputs_[0] = inputs;
  SetupOtherInputs(c);
  return c;
}